

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.cpp
# Opt level: O3

void * NMEADeviceThread(void *pParam)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  tm *ptVar11;
  ulong uVar12;
  int iVar13;
  SOCKET SVar14;
  char *pcVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  time_t tt;
  CHRONO chrono_period;
  char szTemp [256];
  NMEADATA nmeadata;
  NMEADEVICE nmeadevice;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  int local_1164;
  interval local_1160;
  time_t local_1148;
  double local_1140;
  double local_1138;
  double local_1130;
  double local_1128;
  interval local_1120;
  tm local_1108;
  timespec local_10c8;
  double local_10b8;
  double dStack_10b0;
  double local_10a8;
  double dStack_10a0;
  timespec local_1098;
  int local_1088;
  double local_1080;
  double local_1078;
  interval local_1070;
  timeval local_1058;
  char local_1048 [264];
  NMEADATA local_f40;
  NMEADEVICE local_b68;
  char local_238 [256];
  char local_138 [264];
  
  local_1148 = 0;
  iVar13 = (int)pParam;
  sprintf(local_238,"NMEADevice%d.txt",(ulong)pParam & 0xffffffff);
  memset(&local_b68,0,0x930);
  GNSSqualityNMEADevice[iVar13] = 0;
  iVar7 = clock_getres(4,&local_1098);
  if ((iVar7 == 0) && (iVar7 = clock_gettime(4,&local_10c8), iVar7 == 0)) {
    local_1088 = 0;
    local_10b8 = 0.0;
    dStack_10b0 = 0.0;
    local_10a8 = 0.0;
    dStack_10a0 = 0.0;
  }
  iVar7 = 100;
  bVar4 = false;
  local_1164 = 0;
  do {
    bVar4 = !bVar4;
    while( true ) {
      if (local_1088 == 0) {
        clock_gettime(4,(timespec *)&local_1160);
        local_10b8 = local_1160.inf;
        dStack_10b0 = local_1160.sup;
        local_1160.inf =
             (double)((((long)local_1160.inf + (long)local_10a8) - local_10c8.tv_sec) +
                     ((long)local_1160.sup + (long)dStack_10a0) / 1000000000);
        local_1160.sup =
             (double)(((long)local_1160.sup + (long)dStack_10a0) % 1000000000 - local_10c8.tv_nsec);
        if ((long)local_1160.sup < 0) {
          local_1160.inf =
               (double)((long)local_1160.inf + ~((ulong)-(long)local_1160.sup / 1000000000));
          local_1160.sup =
               (double)((long)local_1160.sup + 1000000000 +
                       ((ulong)-(long)local_1160.sup / 1000000000) * 1000000000);
        }
        local_10a8 = local_1160.inf;
        dStack_10a0 = local_1160.sup;
      }
      iVar8 = clock_getres(4,&local_1098);
      if ((iVar8 == 0) && (iVar8 = clock_gettime(4,&local_10c8), iVar8 == 0)) {
        local_1088 = 0;
        local_10a8 = 0.0;
        dStack_10a0 = 0.0;
        local_10b8 = 0.0;
        dStack_10b0 = 0.0;
      }
      local_1160.inf = (double)(long)(iVar7 / 1000);
      local_1160.sup = (double)(long)((iVar7 % 1000) * 1000000);
      nanosleep((timespec *)&local_1160,(timespec *)0x0);
      if (bPauseNMEADevice[iVar13] == 0) break;
      if (!bVar4) {
        puts("NMEADevice paused.");
        SVar14 = local_b68.RS232Port.s;
        GNSSqualityNMEADevice[iVar13] = 0;
        switch(local_b68.RS232Port.DevType) {
        case 0:
          iVar8 = (int)local_b68.RS232Port.hDev;
          goto LAB_00161ccf;
        case 1:
        case 3:
          iVar8 = local_b68.RS232Port.s;
          break;
        case 2:
          shutdown(local_b68.RS232Port.s,2);
          close(SVar14);
        case 4:
          iVar8 = local_b68.RS232Port.s_srv;
          break;
        default:
          goto switchD_00161c91_default;
        }
        shutdown(iVar8,2);
LAB_00161ccf:
        iVar8 = close(iVar8);
        pcVar15 = "NMEADevice disconnected.";
        if (iVar8 != 0) {
switchD_00161c91_default:
          pcVar15 = "NMEADevice disconnection failed.";
        }
        puts(pcVar15);
      }
      if (bExit != 0) goto LAB_001629ad;
      local_1160.inf = 0.0;
      local_1160.sup = 4.94065645841247e-316;
      nanosleep((timespec *)&local_1160,(timespec *)0x0);
      bVar4 = true;
    }
    if (bRestartNMEADevice[iVar13] == 0) {
      if (bVar4) goto LAB_00161ebb;
      iVar8 = GetLatestDataNMEADevice(&local_b68,&local_f40);
      if (iVar8 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if ((local_f40.GPS_quality_indicator < 1) && (local_f40.status != 'A')) {
          GNSSqualityNMEADevice[iVar13] = 0;
        }
        else {
          GNSSqualityNMEADevice[iVar13] = 1;
          dVar16 = angle_env;
          dVar18 = local_f40.Longitude - long_env;
          dVar17 = local_f40.Latitude - lat_env;
          local_1080 = local_f40.Altitude - alt_env;
          local_1128 = cos(local_f40.Latitude * 0.017453292519943295);
          local_1128 = local_1128 * dVar18 * 111194.92664455874;
          dVar17 = dVar17 * 111194.92664455874;
          dVar16 = -dVar16;
          local_1140 = cos(dVar16);
          dVar18 = sin(dVar16);
          local_1140 = local_1140 * local_1128 - dVar18 * dVar17;
          dVar18 = sin(dVar16);
          dVar16 = cos(dVar16);
          dVar16 = dVar18 * local_1128 + dVar16 * dVar17;
          local_1120.inf = local_1140 - GPS_med_acc;
          local_1070.inf = local_1140 + GPS_med_acc;
          interval::interval(&local_1160,&local_1120.inf,&local_1070.inf);
          interval::operator=((interval *)&x_gps,&local_1160);
          local_1120.inf = dVar16 - GPS_med_acc;
          local_1070.inf = dVar16 + GPS_med_acc;
          interval::interval(&local_1160,&local_1120.inf,&local_1070.inf);
          interval::operator=((interval *)&y_gps,&local_1160);
          local_1120.inf = GPS_med_acc * -5.0 + local_1080;
          local_1070.inf = GPS_med_acc * 5.0 + local_1080;
          interval::interval(&local_1160,&local_1120.inf,&local_1070.inf);
          interval::operator=((interval *)&z_gps,&local_1160);
          if ((local_b68.bEnableGPRMC == 0) &&
             (local_b68.bEnableGPGLL != 0 || local_b68.bEnableGPGGA != 0)) {
            local_1108._32_8_ = 0;
            local_1108.tm_gmtoff = 0;
            local_1108.tm_mon = 0;
            local_1108.tm_year = 0;
            local_1108.tm_wday = 0;
            local_1108.tm_yday = 0;
            local_1108.tm_sec = 0;
            local_1108.tm_min = 0;
            local_1108.tm_hour = 0;
            local_1108.tm_mday = 0;
            local_1108.tm_zone = (char *)0x0;
            iVar8 = gettimeofday(&local_1058,(__timezone_ptr_t)0x0);
            if (iVar8 != 0) {
              local_1058.tv_sec = 0;
              local_1058.tv_usec = 0;
            }
            local_1148 = local_1058.tv_sec;
            ptVar11 = gmtime(&local_1148);
            if (ptVar11 != (tm *)0x0) {
              local_1108.tm_year = ptVar11->tm_year;
              uVar2 = ptVar11->tm_mday;
              uVar3 = ptVar11->tm_mon;
              local_1108.tm_mday = uVar2;
              local_1108.tm_mon = uVar3;
            }
            local_1108.tm_hour = local_f40.hour;
            local_1108.tm_min = local_f40.minute;
            local_1108.tm_sec = 0;
            local_1108._32_8_ = local_1108._32_8_ & 0xffffffff00000000;
            local_1148 = timegm(&local_1108);
            utc = (double)local_1148 * 1000.0 + local_f40.second * 1000.0;
          }
        }
        if ((local_b68.bEnableGPRMC != 0 && local_f40.status == 'A') ||
           (local_b68.bEnableGPVTG != 0)) {
          sog = local_f40.SOG;
          dVar16 = fmod((1.5707963267948966 - local_f40.COG) - angle_env,6.283185307179586);
          local_1130 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
          local_1130 = local_1130 + -3.141592653589793;
          interval::interval(&local_1120,&local_1130);
          local_1138 = -3.141592653589793;
          local_1078 = 3.141592653589793;
          interval::interval(&local_1070,&local_1138,&local_1078);
          operator+(&local_1120,&local_1070);
          interval::operator=((interval *)&cog_gps,&local_1160);
        }
        if ((local_b68.bEnableGPRMC != 0) && (local_f40.status == 'A')) {
          local_1108.tm_gmtoff = 0;
          local_1108.tm_zone = (char *)0x0;
          local_1108.tm_wday = 0;
          local_1108.tm_yday = 0;
          local_1108._32_8_ = 0;
          local_1108.tm_mon = local_f40.month + -1;
          local_1108.tm_year = local_f40.year + -0x76c;
          local_1108.tm_mday = local_f40.day;
          local_1108.tm_hour = local_f40.hour;
          local_1108.tm_min = local_f40.minute;
          local_1108.tm_sec = 0;
          local_1148 = timegm(&local_1108);
          utc = (double)local_1148 * 1000.0 + local_f40.second * 1000.0;
        }
        if ((local_b68.bEnableHCHDG != 0) && (robid == 0x8000)) {
          dVar16 = fmod((1.5707963267948966 - local_f40.Heading) - angle_env,6.283185307179586);
          local_1130 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
          local_1130 = local_1130 + -3.141592653589793;
          interval::interval(&local_1120,&local_1130);
          local_1138 = -psi_ahrs_acc;
          interval::interval(&local_1070,&local_1138,&psi_ahrs_acc);
          operator+(&local_1120,&local_1070);
          interval::operator=((interval *)&psi_ahrs,&local_1160);
        }
        if (local_b68.bEnableWIMWV != 0 || local_b68.bEnableIIMWV != 0) {
          dVar16 = fmod(3.141592653589793 - local_f40.ApparentWindDir,6.283185307179586);
          dVar16 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
          dVar16 = dVar16 + -3.141592653589793;
          vawind = local_f40.ApparentWindSpeed;
          psiawind = dVar16;
          if (bDisableRollWindCorrectionSailboat == 0) {
            dVar16 = sin(dVar16);
            dVar17 = Center((interval *)&phi_ahrs);
            dVar17 = cos(dVar17);
            dVar18 = cos(psiawind);
            dVar16 = atan2(dVar16,dVar17 * dVar18);
            dVar17 = Center((interval *)&psi_ahrs);
            dVar16 = fmod(dVar17 + dVar16,6.283185307179586);
            dVar17 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
            dVar16 = vawind;
            psitwind = dVar17 + -3.141592653589793;
            if ((vawind <= 0.0) || (sog < GPS_SOG_for_valid_COG)) goto LAB_00162843;
            dVar19 = sin(psitwind);
            dVar17 = sog;
            dVar18 = Center((interval *)&cog_gps);
            dVar20 = sin(dVar18);
            dVar18 = vawind;
            dVar21 = cos(psitwind);
            dVar16 = atan2(dVar20 * dVar17 + dVar16 * dVar19,dVar18 * dVar21);
            dVar17 = sog;
            dVar18 = Center((interval *)&cog_gps);
            dVar18 = cos(dVar18);
            dVar16 = dVar18 * dVar17 + dVar16;
          }
          else {
            dVar17 = Center((interval *)&psi_ahrs);
            dVar16 = dVar16 + dVar17;
          }
          dVar16 = fmod(dVar16,6.283185307179586);
          dVar16 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
          psitwind = dVar16 + -3.141592653589793;
        }
LAB_00162843:
        if (local_b68.bEnableWIMDA != 0 || local_b68.bEnableWIMWD != 0) {
          dVar16 = fmod(((1.5707963267948966 - local_f40.WindDir) + 3.141592653589793) - angle_env,
                        6.283185307179586);
          dVar16 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
          psitwind = dVar16 + -3.141592653589793;
          vtwind = local_f40.WindSpeed;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_001628d2;
      }
      puts("Connection to a NMEADevice lost.");
      SVar14 = local_b68.RS232Port.s;
      GNSSqualityNMEADevice[iVar13] = 0;
      switch(local_b68.RS232Port.DevType) {
      case 0:
        iVar8 = (int)local_b68.RS232Port.hDev;
        goto LAB_00162346;
      case 1:
      case 3:
        iVar8 = local_b68.RS232Port.s;
        break;
      case 2:
        shutdown(local_b68.RS232Port.s,2);
        close(SVar14);
      case 4:
        iVar8 = local_b68.RS232Port.s_srv;
        break;
      default:
        goto switchD_00161e02_default;
      }
      shutdown(iVar8,2);
LAB_00162346:
      iVar8 = close(iVar8);
      pcVar15 = "NMEADevice disconnected.";
      if (iVar8 != 0) {
switchD_00161e02_default:
        pcVar15 = "NMEADevice disconnection failed.";
      }
      puts(pcVar15);
LAB_00161f03:
      local_1164 = local_1164 + 1;
      if (ExitOnErrorCount <= local_1164 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001629ad:
        bVar5 = true;
        break;
      }
      bVar4 = false;
      bVar5 = true;
    }
    else {
      if (!bVar4) {
        puts("Restarting a NMEADevice.");
        SVar14 = local_b68.RS232Port.s;
        GNSSqualityNMEADevice[iVar13] = 0;
        switch(local_b68.RS232Port.DevType) {
        case 0:
          iVar8 = (int)local_b68.RS232Port.hDev;
          goto LAB_00161e8d;
        case 1:
        case 3:
          iVar8 = local_b68.RS232Port.s;
          break;
        case 2:
          shutdown(local_b68.RS232Port.s,2);
          close(SVar14);
        case 4:
          iVar8 = local_b68.RS232Port.s_srv;
          break;
        default:
          goto switchD_00161d86_default;
        }
        shutdown(iVar8,2);
LAB_00161e8d:
        iVar8 = close(iVar8);
        pcVar15 = "NMEADevice disconnected.";
        if (iVar8 != 0) {
switchD_00161d86_default:
          pcVar15 = "NMEADevice disconnection failed.";
        }
        puts(pcVar15);
      }
      bRestartNMEADevice[iVar13] = 0;
LAB_00161ebb:
      iVar9 = ConnectNMEADevice(&local_b68,local_238);
      iVar8 = local_b68.threadperiod;
      if (iVar9 != 0) {
        GNSSqualityNMEADevice[iVar13] = 0;
        local_1160.inf = 4.94065645841247e-324;
        local_1160.sup = 0.0;
        nanosleep((timespec *)&local_1160,(timespec *)0x0);
        goto LAB_00161f03;
      }
      memset(&local_f40,0,0x3d8);
      if ((FILE *)local_b68.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_b68.pfSaveFile);
        local_b68.pfSaveFile = (FILE *)0x0;
      }
      bVar4 = true;
      iVar7 = iVar8;
      if (local_b68.bSaveRawData == 0) {
LAB_001628d2:
        bVar4 = true;
        bVar5 = false;
      }
      else {
        if (local_b68.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_1048,"nmeadevice",0xb);
        }
        else {
          sprintf(local_1048,"%.127s",local_b68.szCfgFilePath);
        }
        sVar10 = strlen(local_1048);
        iVar8 = (int)sVar10 + 1;
        uVar12 = sVar10 & 0xffffffff;
        do {
          if ((int)uVar12 < 1) goto LAB_00162009;
          uVar1 = uVar12 - 1;
          iVar8 = iVar8 + -1;
          lVar6 = uVar12 - 1;
          uVar12 = uVar1;
        } while (local_1048[lVar6] != '.');
        if ((uVar1 != 0) && (iVar8 <= (int)sVar10)) {
          memset(local_1048 + (uVar1 & 0xffffffff),0,sVar10 - (uVar1 & 0xffffffff));
        }
LAB_00162009:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar15 = strtimeex_fns();
        bVar5 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_1048,pcVar15);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_b68.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_b68.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create NMEADevice data file.");
          bVar5 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
  if (local_1088 == 0) {
    clock_gettime(4,(timespec *)&local_1160);
    local_10b8 = local_1160.inf;
    dStack_10b0 = local_1160.sup;
    local_1160.inf =
         (double)((((long)local_1160.inf + (long)local_10a8) - local_10c8.tv_sec) +
                 ((long)local_1160.sup + (long)dStack_10a0) / 1000000000);
    local_1160.sup =
         (double)(((long)local_1160.sup + (long)dStack_10a0) % 1000000000 - local_10c8.tv_nsec);
    if ((long)local_1160.sup < 0) {
      local_1160.inf = (double)((long)local_1160.inf + ~((ulong)-(long)local_1160.sup / 1000000000))
      ;
      local_1160.sup =
           (double)((long)local_1160.sup + 1000000000 +
                   ((ulong)-(long)local_1160.sup / 1000000000) * 1000000000);
    }
    local_10a8 = local_1160.inf;
    dStack_10a0 = local_1160.sup;
  }
  GNSSqualityNMEADevice[iVar13] = 0;
  if ((FILE *)local_b68.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_b68.pfSaveFile);
    local_b68.pfSaveFile = (FILE *)0x0;
  }
  if (bVar5) goto LAB_00162b2e;
  switch(local_b68.RS232Port.DevType) {
  case 0:
    goto LAB_00162b0e;
  case 1:
  case 3:
    SVar14 = local_b68.RS232Port.s;
    break;
  case 2:
    shutdown(local_b68.RS232Port.s,2);
    close(local_b68.RS232Port.s);
  case 4:
    SVar14 = local_b68.RS232Port.s_srv;
    break;
  default:
    goto switchD_00162ad6_default;
  }
  shutdown(SVar14,2);
  local_b68.RS232Port.hDev._0_4_ = SVar14;
LAB_00162b0e:
  iVar7 = close((int)local_b68.RS232Port.hDev);
  if (iVar7 == 0) {
    pcVar15 = "NMEADevice disconnected.";
  }
  else {
switchD_00162ad6_default:
    pcVar15 = "NMEADevice disconnection failed.";
  }
  puts(pcVar15);
LAB_00162b2e:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE nmeadevice;
	NMEADATA nmeadata;
	struct tm t;
	time_t tt = 0;
	struct timeval tv;
	struct tm* timeptr = NULL;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "NMEADevice%d.txt", deviceid);

	memset(&nmeadevice, 0, sizeof(NMEADEVICE));

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("NMEADevice paused.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a NMEADevice.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			bRestartNMEADevice[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNMEADevice(&nmeadevice, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nmeadevice.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nmeadevice.pfSaveFile != NULL)
				{
					fclose(nmeadevice.pfSaveFile); 
					nmeadevice.pfSaveFile = NULL;
				}
				if ((nmeadevice.bSaveRawData)&&(nmeadevice.pfSaveFile == NULL)) 
				{
					if (strlen(nmeadevice.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nmeadevice.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nmeadevice");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nmeadevice.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nmeadevice.pfSaveFile == NULL) 
					{
						printf("Unable to create NMEADevice data file.\n");
						break;
					}
				}
			}
			else 
			{
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataNMEADevice(&nmeadevice, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				//printf("GPS_quality_indicator : %d, status : %c\n", nmeadata.GPS_quality_indicator, nmeadata.status);

				if ((nmeadata.GPS_quality_indicator > 0)||(nmeadata.status == 'A'))
				{
					GNSSqualityNMEADevice[deviceid] = AUTONOMOUS_GNSS_FIX;

					// Old...

					double x_gps_mes = 0, y_gps_mes = 0, z_gps_mes = 0;
					GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, nmeadata.Latitude, nmeadata.Longitude, nmeadata.Altitude, &x_gps_mes, &y_gps_mes, &z_gps_mes);
					// Default accuracy...
					x_gps = interval(x_gps_mes-GPS_med_acc, x_gps_mes+GPS_med_acc);
					y_gps = interval(y_gps_mes-GPS_med_acc, y_gps_mes+GPS_med_acc);
					z_gps = interval(z_gps_mes-5*GPS_med_acc, z_gps_mes+5*GPS_med_acc);

					if ((!nmeadevice.bEnableGPRMC)&&(nmeadevice.bEnableGPGGA||nmeadevice.bEnableGPGLL))
					{
						// Try to extrapolate UTC as ms from the computer date since not all the time and date data are available in GGA or GLL...
						memset(&t, 0, sizeof(t));
						if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
						tt = tv.tv_sec;
						timeptr = gmtime(&tt);
						if (timeptr != NULL)
						{
							t.tm_year = timeptr->tm_year; t.tm_mon = timeptr->tm_mon; t.tm_mday = timeptr->tm_mday;
						}
						t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
						tt = timegm(&t);
						utc = tt*1000.0+nmeadata.second*1000.0;
					}
				}
				else
				{
					GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				}

				// Should check better if valid...
				if ((nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))||nmeadevice.bEnableGPVTG)
				{
					sog = nmeadata.SOG;
					cog_gps = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
				}

				if (nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))
				{
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = nmeadata.year-1900; t.tm_mon = nmeadata.month-1; t.tm_mday = nmeadata.day; 
					t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+nmeadata.second*1000.0;
				}

				if (nmeadevice.bEnableHCHDG)
				{
					if (robid == SAILBOAT2_ROBID) psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				}

				if (nmeadevice.bEnableIIMWV||nmeadevice.bEnableWIMWV)
				{
					// Apparent wind (in robot coordinate system).
					psiawind = fmod_2PI(-nmeadata.ApparentWindDir+M_PI); 
					vawind = nmeadata.ApparentWindSpeed;
					// True wind must be computed from apparent wind.
					if (bDisableRollWindCorrectionSailboat)
						psitwind = fmod_2PI(psiawind+Center(psi_ahrs)); // Robot speed and roll not taken into account...
					else
					{
						psitwind = fmod_2PI(atan2(sin(psiawind),cos(Center(phi_ahrs))*cos(psiawind))+Center(psi_ahrs)); // Robot speed not taken into account, but with roll correction...
						if ((vawind > 0)&&(sog >= GPS_SOG_for_valid_COG))
						{
							psitwind = fmod_2PI(atan2(vawind*sin(psitwind)+sog*sin(Center(cog_gps)),vawind*cos(psitwind))+sog*cos(Center(cog_gps))); // With speed correction...
						}
					}
				}

				if (nmeadevice.bEnableWIMWD||nmeadevice.bEnableWIMDA)
				{
					// True wind.
					psitwind = fmod_2PI(M_PI/2.0-nmeadata.WindDir+M_PI-angle_env);
					vtwind = nmeadata.WindSpeed;
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NMEADevice lost.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}		
		}

		//printf("NMEADeviceThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	if (nmeadevice.pfSaveFile != NULL)
	{
		fclose(nmeadevice.pfSaveFile); 
		nmeadevice.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNMEADevice(&nmeadevice);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}